

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O0

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  ring_buffer_size_t rVar1;
  ring_buffer_size_t local_60;
  SAMPLE *wptr;
  ring_buffer_size_t elementsToRead;
  ring_buffer_size_t elementsToPlay;
  paTestData *data;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  local_60 = PaUtil_GetRingBufferReadAvailable((PaUtilRingBuffer *)((long)userData + 0x10));
  if (SBORROW8(local_60,framesPerBuffer * 2) == (long)(local_60 + framesPerBuffer * -2) < 0) {
    local_60 = framesPerBuffer << 1;
  }
  rVar1 = PaUtil_ReadRingBuffer((PaUtilRingBuffer *)((long)userData + 0x10),outputBuffer,local_60);
  *(int *)userData = *userData + (int)rVar1;
  return (uint)(*(int *)((long)userData + 4) != 0);
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    ring_buffer_size_t elementsToPlay = PaUtil_GetRingBufferReadAvailable(&data->ringBuffer);
    ring_buffer_size_t elementsToRead = min(elementsToPlay, (ring_buffer_size_t)(framesPerBuffer * NUM_CHANNELS));
    SAMPLE* wptr = (SAMPLE*)outputBuffer;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    data->frameIndex += PaUtil_ReadRingBuffer(&data->ringBuffer, wptr, elementsToRead);

    return data->threadSyncFlag ? paComplete : paContinue;
}